

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldInterpolatorTests.cpp
# Opt level: O0

void __thiscall
FieldInterpolatorTest_Constructor_Test::TestBody(FieldInterpolatorTest_Constructor_Test *this)

{
  FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)3,_double>_> interpolator3;
  YeeGrid<(pica::Dimension)3,_double> grid3;
  FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)2,_double>_> interpolator2;
  YeeGrid<(pica::Dimension)2,_double> grid2;
  Vector3<double> b;
  Vector3<double> e;
  FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_> interpolator;
  YeeGrid<(pica::Dimension)1,_double> grid;
  int size;
  double step;
  double origin;
  IndexType *in_stack_fffffffffffffa88;
  PositionType *step_00;
  PositionType *origin_00;
  YeeGrid<(pica::Dimension)3,_double> *this_00;
  Vector3<int> local_4fc;
  Vector3<double> local_4f0;
  Vector3<double> *in_stack_fffffffffffffb38;
  Vector3<double> *in_stack_fffffffffffffb40;
  FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_> *in_stack_fffffffffffffb48;
  PositionType in_stack_fffffffffffffb50;
  Vector2<int> local_2f0;
  Vector2<double> local_2e8;
  Vector2<double> local_2d8 [21];
  Vector1<double> local_188;
  Vector3<double> local_180;
  Vector3<double> local_168 [3];
  undefined1 local_11c [12];
  PositionType local_110 [10];
  int local_1c;
  double local_18;
  undefined8 local_10;
  
  local_10 = 0xbff8000000000000;
  local_18 = 0.5;
  local_1c = 10;
  step_00 = local_110;
  pica::Vector1<double>::Vector1((Vector1<double> *)step_00,-1.5);
  origin_00 = (PositionType *)(local_11c + 4);
  pica::Vector1<double>::Vector1((Vector1<double> *)origin_00,local_18);
  this_00 = (YeeGrid<(pica::Dimension)3,_double> *)local_11c;
  pica::Vector1<int>::Vector1((Vector1<int> *)this_00,local_1c);
  pica::YeeGrid<(pica::Dimension)1,_double>::YeeGrid
            ((YeeGrid<(pica::Dimension)1,_double> *)this_00,(PositionType *)origin_00,
             (PositionType *)step_00,(IndexType *)in_stack_fffffffffffffa88);
  pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_>::FieldInterpolatorCIC
            ((FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_> *)step_00,
             (GridType *)in_stack_fffffffffffffa88);
  pica::Vector3<double>::Vector3(local_168);
  pica::Vector3<double>::Vector3(&local_180);
  pica::Vector1<double>::Vector1(&local_188,1.0);
  pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_>::get
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb38);
  pica::Vector2<double>::Vector2(local_2d8,1.0,1.0);
  pica::Vector2<double>::Vector2(&local_2e8,2.0,2.0);
  pica::Vector2<int>::Vector2(&local_2f0,3,5);
  pica::YeeGrid<(pica::Dimension)2,_double>::YeeGrid
            ((YeeGrid<(pica::Dimension)2,_double> *)this_00,(PositionType *)origin_00,
             (PositionType *)step_00,(IndexType *)in_stack_fffffffffffffa88);
  pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)2,_double>_>::FieldInterpolatorCIC
            ((FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)2,_double>_> *)step_00,
             (GridType *)in_stack_fffffffffffffa88);
  pica::Vector3<double>::Vector3((Vector3<double> *)&stack0xfffffffffffffb28,1.0,1.0,1.0);
  pica::Vector3<double>::Vector3(&local_4f0,2.0,2.0,2.0);
  pica::Vector3<int>::Vector3(&local_4fc,3,5,7);
  pica::YeeGrid<(pica::Dimension)3,_double>::YeeGrid
            (this_00,origin_00,step_00,in_stack_fffffffffffffa88);
  pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)3,_double>_>::FieldInterpolatorCIC
            ((FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)3,_double>_> *)step_00,
             (GridType *)in_stack_fffffffffffffa88);
  pica::YeeGrid<(pica::Dimension)3,_double>::~YeeGrid
            ((YeeGrid<(pica::Dimension)3,_double> *)0x1c6624);
  pica::YeeGrid<(pica::Dimension)2,_double>::~YeeGrid
            ((YeeGrid<(pica::Dimension)2,_double> *)0x1c6631);
  pica::YeeGrid<(pica::Dimension)1,_double>::~YeeGrid
            ((YeeGrid<(pica::Dimension)1,_double> *)0x1c663e);
  return;
}

Assistant:

TEST(FieldInterpolatorTest, Constructor)
{
    double origin = -1.5;
    double step = 0.5;
    int size = 10;
    YeeGrid<One, double> grid(origin, step, size);
    FieldInterpolatorCIC<YeeGrid<One, double> > interpolator(grid);
    Vector3<double> e, b;
    interpolator.get(1.0, e, b);

    YeeGrid<Two, double> grid2(Vector2<double>(1.0, 1.0), Vector2<double>(2.0, 2.0), Vector2<int>(3, 5));
    FieldInterpolatorCIC<YeeGrid<Two, double> > interpolator2(grid2);

    YeeGrid<Three, double> grid3(Vector3<double>(1.0, 1.0, 1.0), Vector3<double>(2.0, 2.0, 2.0), Vector3<int>(3, 5, 7));
    FieldInterpolatorCIC<YeeGrid<Three, double> > interpolator3(grid3);
}